

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O3

CreateMode __thiscall create::Create::getMode(Create *this)

{
  bool bVar1;
  uint16_t uVar2;
  CreateMode CVar3;
  Packet *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  bVar1 = Data::isValidPacketID
                    ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,'#');
  if (bVar1) {
    if (this->modeReportWorkaround == true) {
      Data::getPacket((Data *)&local_20,
                      (uint8_t)(this->data).
                               super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar2 = Packet::getData(local_20);
      CVar3 = (uint)uVar2 + MODE_UNAVAILABLE;
    }
    else {
      Data::getPacket((Data *)&local_20,
                      (uint8_t)(this->data).
                               super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar2 = Packet::getData(local_20);
      CVar3 = (CreateMode)uVar2;
    }
    this->mode = CVar3;
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  return this->mode;
}

Assistant:

create::CreateMode Create::getMode() {
    if (data->isValidPacketID(ID_OI_MODE)) {
      if (modeReportWorkaround) {
        mode = (create::CreateMode) (GET_DATA(ID_OI_MODE) - 1);
      } else {
        mode = (create::CreateMode) GET_DATA(ID_OI_MODE);
      }
    }

    return mode;
  }